

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::_::
concat<kj::CappedArray<char,14ul>,kj::FixedArray<char,1ul>,kj::CappedArray<char,14ul>,kj::FixedArray<char,1ul>,kj::CappedArray<char,14ul>>
          (String *__return_storage_ptr__,_ *this,CappedArray<char,_14UL> *params,
          FixedArray<char,_1UL> *params_1,CappedArray<char,_14UL> *params_2,
          FixedArray<char,_1UL> *params_3,CappedArray<char,_14UL> *params_4)

{
  size_t size;
  char *target;
  CappedArray<char,_14UL> *first;
  FixedArray<char,_1UL> *rest;
  CappedArray<char,_14UL> *rest_1;
  FixedArray<char,_1UL> *rest_2;
  CappedArray<char,_14UL> *rest_3;
  size_type extraout_RDX;
  initializer_list<unsigned_long> nums;
  size_t local_78;
  size_t local_70;
  size_t local_68;
  size_t local_60;
  size_t local_58;
  _ *local_50;
  undefined8 local_48;
  undefined1 local_39;
  CappedArray<char,_14UL> *local_38;
  CappedArray<char,_14UL> *params_local_4;
  FixedArray<char,_1UL> *params_local_3;
  CappedArray<char,_14UL> *params_local_2;
  FixedArray<char,_1UL> *params_local_1;
  CappedArray<char,_14UL> *params_local;
  String *result;
  
  local_39 = 0;
  local_38 = (CappedArray<char,_14UL> *)params_3;
  params_local_4 = params_2;
  params_local_3 = params_1;
  params_local_2 = params;
  params_local_1 = (FixedArray<char,_1UL> *)this;
  params_local = (CappedArray<char,_14UL> *)__return_storage_ptr__;
  local_78 = CappedArray<char,_14UL>::size((CappedArray<char,_14UL> *)this);
  local_70 = FixedArray<char,_1UL>::size((FixedArray<char,_1UL> *)params_local_2);
  local_68 = CappedArray<char,_14UL>::size((CappedArray<char,_14UL> *)params_local_3);
  local_60 = FixedArray<char,_1UL>::size((FixedArray<char,_1UL> *)params_local_4);
  local_58 = CappedArray<char,_14UL>::size(local_38);
  local_50 = (_ *)&local_78;
  local_48 = 5;
  nums._M_len = extraout_RDX;
  nums._M_array = (iterator)0x5;
  size = sum(local_50,nums);
  heapString(__return_storage_ptr__,size);
  target = String::begin(__return_storage_ptr__);
  first = fwd<kj::CappedArray<char,14ul>>((NoInfer<kj::CappedArray<char,_14UL>_> *)params_local_1);
  rest = fwd<kj::FixedArray<char,1ul>>((NoInfer<kj::FixedArray<char,_1UL>_> *)params_local_2);
  rest_1 = fwd<kj::CappedArray<char,14ul>>((NoInfer<kj::CappedArray<char,_14UL>_> *)params_local_3);
  rest_2 = fwd<kj::FixedArray<char,1ul>>((NoInfer<kj::FixedArray<char,_1UL>_> *)params_local_4);
  rest_3 = fwd<kj::CappedArray<char,14ul>>(local_38);
  fill<kj::CappedArray<char,14ul>,kj::FixedArray<char,1ul>,kj::CappedArray<char,14ul>,kj::FixedArray<char,1ul>,kj::CappedArray<char,14ul>>
            (target,first,rest,rest_1,rest_2,rest_3);
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}